

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int casttoken(LexState *ls,SemInfo *seminfo)

{
  size_t __n;
  char *__s1;
  int iVar1;
  TString *pTVar2;
  int local_2c;
  int tok;
  char *s;
  size_t n;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  __n = ls->buff->n;
  __s1 = ls->buff->buffer;
  iVar1 = strncmp(__s1,"@integer",__n);
  if (iVar1 == 0) {
    local_2c = 0x127;
  }
  else {
    iVar1 = strncmp(__s1,"@integer[]",__n);
    if (iVar1 == 0) {
      local_2c = 0x129;
    }
    else {
      iVar1 = strncmp(__s1,"@number",__n);
      if (iVar1 == 0) {
        local_2c = 0x128;
      }
      else {
        iVar1 = strncmp(__s1,"@number[]",__n);
        if (iVar1 == 0) {
          local_2c = 0x12a;
        }
        else {
          iVar1 = strncmp(__s1,"@table",__n);
          if (iVar1 == 0) {
            local_2c = 299;
          }
          else {
            iVar1 = strncmp(__s1,"@string",__n);
            if (iVar1 == 0) {
              local_2c = 300;
            }
            else {
              iVar1 = strncmp(__s1,"@closure",__n);
              if (iVar1 == 0) {
                local_2c = 0x12d;
              }
              else {
                pTVar2 = luaX_newstring(ls,__s1 + 1,__n - 1);
                seminfo->ts = pTVar2;
                local_2c = 0x40;
              }
            }
          }
        }
      }
    }
  }
  ls->buff->n = ls->buff->n - __n;
  return local_2c;
}

Assistant:

static int casttoken(LexState *ls, SemInfo *seminfo) {
  size_t n = luaZ_bufflen(ls->buff);
  const char *s = luaZ_buffer(ls->buff);
  int tok;

  /* @integer or @integer[] */
  if (strncmp(s, "@integer", n) == 0) 
    tok = TK_TO_INTEGER;
  else if (strncmp(s, "@integer[]", n) == 0)
    tok = TK_TO_INTARRAY;
  /* @number or @number[] */
  else if (strncmp(s, "@number", n) == 0)
    tok = TK_TO_NUMBER;
  else if (strncmp(s, "@number[]", n) == 0)
    tok = TK_TO_NUMARRAY;
  /* @table */
  else if (strncmp(s, "@table", n) == 0)
    tok = TK_TO_TABLE;
  else if (strncmp(s, "@string", n) == 0)
    tok = TK_TO_STRING;
  else if (strncmp(s, "@closure", n) == 0)
    tok = TK_TO_CLOSURE;
  else {
    seminfo->ts = luaX_newstring(ls, s+1, n-1); /* omit @ */
    tok = '@';
  }
  luaZ_buffremove(ls->buff, n); /* rewind but buffer still holds the saved characters */
  return tok;
}